

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O1

void av1_init_quantizer(EncQuantDequantParams *enc_quant_dequant_params,
                       CommonQuantParams *quant_params,aom_bit_depth_t bit_depth,int sharpness)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  quant_params->sharpness = sharpness;
  if (((((enc_quant_dequant_params->prev_deltaq_params).y_dc_delta_q != quant_params->y_dc_delta_q)
       || ((enc_quant_dequant_params->prev_deltaq_params).u_dc_delta_q != quant_params->u_dc_delta_q
          )) || ((enc_quant_dequant_params->prev_deltaq_params).v_dc_delta_q !=
                 quant_params->v_dc_delta_q)) ||
     ((((enc_quant_dequant_params->prev_deltaq_params).u_ac_delta_q != quant_params->u_ac_delta_q ||
       ((enc_quant_dequant_params->prev_deltaq_params).v_ac_delta_q != quant_params->v_ac_delta_q))
      || ((enc_quant_dequant_params->prev_deltaq_params).sharpness != sharpness)))) {
    av1_build_quantizer(bit_depth,quant_params->y_dc_delta_q,quant_params->u_dc_delta_q,
                        quant_params->u_ac_delta_q,quant_params->v_dc_delta_q,
                        quant_params->v_ac_delta_q,&enc_quant_dequant_params->quants,
                        &enc_quant_dequant_params->dequants,sharpness);
    iVar1 = quant_params->u_dc_delta_q;
    iVar2 = quant_params->v_dc_delta_q;
    iVar3 = quant_params->u_ac_delta_q;
    (enc_quant_dequant_params->prev_deltaq_params).y_dc_delta_q = quant_params->y_dc_delta_q;
    (enc_quant_dequant_params->prev_deltaq_params).u_dc_delta_q = iVar1;
    (enc_quant_dequant_params->prev_deltaq_params).u_ac_delta_q = iVar3;
    (enc_quant_dequant_params->prev_deltaq_params).v_dc_delta_q = iVar2;
    (enc_quant_dequant_params->prev_deltaq_params).v_ac_delta_q = quant_params->v_ac_delta_q;
    (enc_quant_dequant_params->prev_deltaq_params).sharpness = sharpness;
  }
  return;
}

Assistant:

void av1_init_quantizer(EncQuantDequantParams *const enc_quant_dequant_params,
                        CommonQuantParams *quant_params,
                        aom_bit_depth_t bit_depth, int sharpness) {
  DeltaQuantParams *const prev_deltaq_params =
      &enc_quant_dequant_params->prev_deltaq_params;
  quant_params->sharpness = sharpness;

  // Re-initialize the quantizer only if any of the dc/ac deltaq parameters
  // change.
  if (!deltaq_params_have_changed(prev_deltaq_params, quant_params)) return;
  QUANTS *const quants = &enc_quant_dequant_params->quants;
  Dequants *const dequants = &enc_quant_dequant_params->dequants;
  av1_build_quantizer(bit_depth, quant_params->y_dc_delta_q,
                      quant_params->u_dc_delta_q, quant_params->u_ac_delta_q,
                      quant_params->v_dc_delta_q, quant_params->v_ac_delta_q,
                      quants, dequants, sharpness);

  // Record the state of deltaq parameters.
  prev_deltaq_params->y_dc_delta_q = quant_params->y_dc_delta_q;
  prev_deltaq_params->u_dc_delta_q = quant_params->u_dc_delta_q;
  prev_deltaq_params->v_dc_delta_q = quant_params->v_dc_delta_q;
  prev_deltaq_params->u_ac_delta_q = quant_params->u_ac_delta_q;
  prev_deltaq_params->v_ac_delta_q = quant_params->v_ac_delta_q;
  prev_deltaq_params->sharpness = sharpness;
}